

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5SegiterPoslist(Fts5Index *p,Fts5SegIter *pSeg,Fts5Colset *pColset,Fts5Buffer *pBuf)

{
  u8 *puVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  code *xChunk;
  long lVar5;
  uint nByte;
  PoslistCallbackCtx sCtx;
  Fts5Buffer *local_38;
  Fts5Colset *local_30;
  undefined8 local_28;
  
  iVar2 = pBuf->n;
  iVar3 = pSeg->nPos;
  nByte = iVar2 + iVar3 + 8;
  if ((uint)pBuf->nSpace < nByte) {
    iVar2 = sqlite3Fts5BufferSize(&p->rc,pBuf,nByte);
    if (iVar2 != 0) {
      return;
    }
    iVar2 = pBuf->n;
    iVar3 = pSeg->nPos;
  }
  puVar1 = pBuf->p + (iVar3 + iVar2);
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  if (pColset == (Fts5Colset *)0x0) {
    fts5ChunkIterate(p,pSeg,pBuf,fts5PoslistCallback);
    return;
  }
  if (p->pConfig->eDetail == 0) {
    if (0 < (long)pColset->nCol) {
      lVar5 = 0;
      do {
        if (pColset->aiCol[lVar5] == 0) {
          uVar4 = 1;
          goto LAB_001cdc39;
        }
        lVar5 = lVar5 + 1;
      } while (pColset->nCol != lVar5);
    }
    uVar4 = 0;
LAB_001cdc39:
    local_28 = CONCAT44(local_28._4_4_,uVar4);
    xChunk = fts5PoslistFilterCallback;
  }
  else {
    local_28 = 0;
    xChunk = fts5PoslistOffsetsCallback;
  }
  local_38 = pBuf;
  local_30 = pColset;
  fts5ChunkIterate(p,pSeg,&local_38,xChunk);
  return;
}

Assistant:

static void fts5SegiterPoslist(
  Fts5Index *p,
  Fts5SegIter *pSeg,
  Fts5Colset *pColset,
  Fts5Buffer *pBuf
){
  if( 0==fts5BufferGrow(&p->rc, pBuf, pSeg->nPos+FTS5_DATA_ZERO_PADDING) ){
    memset(&pBuf->p[pBuf->n+pSeg->nPos], 0, FTS5_DATA_ZERO_PADDING);
    if( pColset==0 ){
      fts5ChunkIterate(p, pSeg, (void*)pBuf, fts5PoslistCallback);
    }else{
      if( p->pConfig->eDetail==FTS5_DETAIL_FULL ){
        PoslistCallbackCtx sCtx;
        sCtx.pBuf = pBuf;
        sCtx.pColset = pColset;
        sCtx.eState = fts5IndexColsetTest(pColset, 0);
        assert( sCtx.eState==0 || sCtx.eState==1 );
        fts5ChunkIterate(p, pSeg, (void*)&sCtx, fts5PoslistFilterCallback);
      }else{
        PoslistOffsetsCtx sCtx;
        memset(&sCtx, 0, sizeof(sCtx));
        sCtx.pBuf = pBuf;
        sCtx.pColset = pColset;
        fts5ChunkIterate(p, pSeg, (void*)&sCtx, fts5PoslistOffsetsCallback);
      }
    }
  }
}